

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::MPSreadBounds<double>
               (MPSInput *mps,LPColSetBase<double> *cset,NameSet *cnames,DIdxSet *intvars,
               SPxOut *spxout)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  Verbosity VVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  double *pdVar8;
  long in_RCX;
  MPSInput *in_RDI;
  SPxOut *in_R8;
  Verbosity old_verbosity;
  double val;
  int idx;
  char bndname [256];
  DIdxSet oldbinvars;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  MPSInput *in_stack_fffffffffffffda0;
  NameSet *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdb8;
  MPSInput *in_stack_fffffffffffffdc0;
  MPSInput *in_stack_fffffffffffffe38;
  undefined4 local_16c;
  Verbosity local_168 [4];
  double local_158;
  int local_14c;
  char local_148 [288];
  SPxOut *local_28;
  long local_20;
  MPSInput *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  DIdxSet::DIdxSet((DIdxSet *)in_stack_fffffffffffffdc0,
                   (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  memset(local_148,0,0x100);
  do {
    bVar3 = MPSInput::readLine(in_stack_fffffffffffffe38);
    if (!bVar3) {
LAB_001b2ac0:
      MPSInput::syntaxError(in_stack_fffffffffffffda0);
LAB_001b2ada:
      DIdxSet::~DIdxSet((DIdxSet *)in_stack_fffffffffffffda0);
      return;
    }
    pcVar6 = MPSInput::field0(local_8);
    if (pcVar6 != (char *)0x0) {
      if ((local_28 != (SPxOut *)0x0) && (VVar4 = SPxOut::getVerbosity(local_28), 3 < (int)VVar4)) {
        local_168[0] = SPxOut::getVerbosity(local_28);
        local_16c = 4;
        (*local_28->_vptr_SPxOut[2])(local_28,&local_16c);
        operator<<((SPxOut *)in_stack_fffffffffffffda0,
                   (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        operator<<((SPxOut *)in_stack_fffffffffffffda0,
                   (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        operator<<((SPxOut *)in_stack_fffffffffffffda0,
                   (_func_ostream_ptr_ostream_ptr *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        (*local_28->_vptr_SPxOut[2])(local_28,local_168);
      }
      pcVar6 = MPSInput::field0(local_8);
      iVar5 = strcmp(pcVar6,"ENDATA");
      if (iVar5 == 0) {
        MPSInput::setSection(local_8,ENDATA);
        goto LAB_001b2ada;
      }
      goto LAB_001b2ac0;
    }
    pcVar6 = MPSInput::field1(local_8);
    iVar5 = strcmp(pcVar6,"LO");
    if (iVar5 == 0) {
LAB_001b23e0:
      pcVar6 = MPSInput::field3(local_8);
      if ((pcVar6 != (char *)0x0) && (pcVar6 = MPSInput::field4(local_8), pcVar6 == (char *)0x0)) {
        MPSInput::insertName(local_8,"_BND_",true);
      }
    }
    else {
      pcVar6 = MPSInput::field1(local_8);
      iVar5 = strcmp(pcVar6,"UP");
      if (iVar5 == 0) goto LAB_001b23e0;
      pcVar6 = MPSInput::field1(local_8);
      iVar5 = strcmp(pcVar6,"FX");
      if (iVar5 == 0) goto LAB_001b23e0;
      pcVar6 = MPSInput::field1(local_8);
      iVar5 = strcmp(pcVar6,"LI");
      if (iVar5 == 0) goto LAB_001b23e0;
      pcVar6 = MPSInput::field1(local_8);
      iVar5 = strcmp(pcVar6,"UI");
      if (iVar5 == 0) goto LAB_001b23e0;
      pcVar6 = MPSInput::field2(local_8);
      if ((pcVar6 != (char *)0x0) && (pcVar6 = MPSInput::field3(local_8), pcVar6 == (char *)0x0)) {
        MPSInput::insertName(local_8,"_BND_",true);
      }
    }
    pcVar6 = MPSInput::field1(local_8);
    if (((pcVar6 == (char *)0x0) || (pcVar6 = MPSInput::field2(local_8), pcVar6 == (char *)0x0)) ||
       (pcVar6 = MPSInput::field3(local_8), pcVar6 == (char *)0x0)) goto LAB_001b2ac0;
    if (local_148[0] == '\0') {
      pcVar6 = local_148;
      pcVar7 = MPSInput::field2(local_8);
      spxSnprintf(pcVar6,0x100,"%s",pcVar7);
    }
    pcVar6 = MPSInput::field2(local_8);
    iVar5 = strcmp(local_148,pcVar6);
    if (iVar5 == 0) {
      MPSInput::field3(local_8);
      local_14c = NameSet::number(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      if (local_14c < 0) {
        MPSInput::field3(local_8);
        MPSInput::entryIgnored
                  (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                   (char *)in_stack_fffffffffffffda0);
      }
      else {
        pcVar6 = MPSInput::field4(local_8);
        if (pcVar6 == (char *)0x0) {
          local_158 = 0.0;
        }
        else {
          pcVar6 = MPSInput::field4(local_8);
          iVar5 = strcmp(pcVar6,"-Inf");
          if (iVar5 != 0) {
            pcVar6 = MPSInput::field4(local_8);
            iVar5 = strcmp(pcVar6,"-inf");
            if (iVar5 != 0) {
              pcVar6 = MPSInput::field4(local_8);
              iVar5 = strcmp(pcVar6,"Inf");
              if (iVar5 != 0) {
                pcVar6 = MPSInput::field4(local_8);
                iVar5 = strcmp(pcVar6,"inf");
                if (iVar5 != 0) {
                  pcVar6 = MPSInput::field4(local_8);
                  iVar5 = strcmp(pcVar6,"+Inf");
                  if (iVar5 != 0) {
                    pcVar6 = MPSInput::field4(local_8);
                    iVar5 = strcmp(pcVar6,"+inf");
                    if (iVar5 != 0) {
                      pcVar6 = MPSInput::field4(local_8);
                      local_158 = atof(pcVar6);
                      goto LAB_001b26ff;
                    }
                  }
                }
              }
              pdVar8 = (double *)infinity();
              local_158 = *pdVar8;
              goto LAB_001b26ff;
            }
          }
          pdVar8 = (double *)infinity();
          local_158 = -*pdVar8;
        }
LAB_001b26ff:
        pcVar6 = MPSInput::field1(local_8);
        if (pcVar6[1] == 'I') {
          if (local_20 != 0) {
            DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
          }
          iVar5 = IdxSet::pos((IdxSet *)in_stack_fffffffffffffda8,
                              (int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
          if (iVar5 < 0) {
            pdVar8 = (double *)infinity();
            in_stack_fffffffffffffe38 = (MPSInput *)*pdVar8;
            pdVar8 = LPColSetBase<double>::upper_w
                               ((LPColSetBase<double> *)in_stack_fffffffffffffda0,
                                in_stack_fffffffffffffd9c);
            *pdVar8 = (double)in_stack_fffffffffffffe38;
            DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
          }
        }
        pcVar6 = MPSInput::field1(local_8);
        dVar1 = local_158;
        switch(*pcVar6) {
        case 'B':
          in_stack_fffffffffffffda8 =
               (NameSet *)
               LPColSetBase<double>::lower_w
                         ((LPColSetBase<double> *)in_stack_fffffffffffffda0,
                          in_stack_fffffffffffffd9c);
          (in_stack_fffffffffffffda8->set).theitem = (Item *)0x0;
          in_stack_fffffffffffffda0 =
               (MPSInput *)
               LPColSetBase<double>::upper_w
                         ((LPColSetBase<double> *)in_stack_fffffffffffffda0,
                          in_stack_fffffffffffffd9c);
          (((SVSetBase<double> *)&in_stack_fffffffffffffda0->_vptr_MPSInput)->
          super_ClassArray<soplex::Nonzero<double>_>)._vptr_ClassArray =
               (_func_int **)0x3ff0000000000000;
          if (local_20 != 0) {
            DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
          }
          break;
        default:
          MPSInput::syntaxError(in_stack_fffffffffffffda0);
          goto LAB_001b2ada;
        case 'F':
          pcVar6 = MPSInput::field1(local_8);
          dVar1 = local_158;
          if (pcVar6[1] == 'X') {
            pdVar8 = LPColSetBase<double>::lower_w
                               ((LPColSetBase<double> *)in_stack_fffffffffffffda0,
                                in_stack_fffffffffffffd9c);
            dVar2 = local_158;
            *pdVar8 = dVar1;
            pdVar8 = LPColSetBase<double>::upper_w
                               ((LPColSetBase<double> *)in_stack_fffffffffffffda0,
                                in_stack_fffffffffffffd9c);
            *pdVar8 = dVar2;
          }
          else {
            pdVar8 = (double *)infinity();
            dVar1 = *pdVar8;
            pdVar8 = LPColSetBase<double>::lower_w
                               ((LPColSetBase<double> *)in_stack_fffffffffffffda0,
                                in_stack_fffffffffffffd9c);
            *pdVar8 = -dVar1;
            pdVar8 = (double *)infinity();
            dVar1 = *pdVar8;
            pdVar8 = LPColSetBase<double>::upper_w
                               ((LPColSetBase<double> *)in_stack_fffffffffffffda0,
                                in_stack_fffffffffffffd9c);
            *pdVar8 = dVar1;
          }
          break;
        case 'L':
          pdVar8 = LPColSetBase<double>::lower_w
                             ((LPColSetBase<double> *)in_stack_fffffffffffffda0,
                              in_stack_fffffffffffffd9c);
          *pdVar8 = dVar1;
          break;
        case 'M':
          pdVar8 = (double *)infinity();
          in_stack_fffffffffffffdc0 = (MPSInput *)((ulong)*pdVar8 ^ 0x8000000000000000);
          pdVar8 = LPColSetBase<double>::lower_w
                             ((LPColSetBase<double> *)in_stack_fffffffffffffda0,
                              in_stack_fffffffffffffd9c);
          *pdVar8 = (double)in_stack_fffffffffffffdc0;
          break;
        case 'P':
          pdVar8 = (double *)infinity();
          in_stack_fffffffffffffdb0 = (char *)*pdVar8;
          in_stack_fffffffffffffdb8 =
               LPColSetBase<double>::upper_w
                         ((LPColSetBase<double> *)in_stack_fffffffffffffda0,
                          in_stack_fffffffffffffd9c);
          *in_stack_fffffffffffffdb8 = (double)in_stack_fffffffffffffdb0;
          break;
        case 'U':
          pdVar8 = LPColSetBase<double>::upper_w
                             ((LPColSetBase<double> *)in_stack_fffffffffffffda0,
                              in_stack_fffffffffffffd9c);
          *pdVar8 = dVar1;
        }
      }
    }
  } while( true );
}

Assistant:

static void MPSreadBounds(MPSInput& mps, LPColSetBase<R>& cset, const NameSet& cnames,
                          DIdxSet* intvars, SPxOut* spxout)
{
   DIdxSet oldbinvars;
   char bndname[MPSInput::MAX_LINE_LEN] = { '\0' };
   int  idx;
   R val;

   while(mps.readLine())
   {
      if(mps.field0() != nullptr)
      {
         SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD05 Bound name     : " << bndname << std::endl;)

         if(strcmp(mps.field0(), "ENDATA"))
            break;

         mps.setSection(MPSInput::ENDATA);

         return;
      }

      // Is the value field used ?
      if((!strcmp(mps.field1(), "LO"))
            || (!strcmp(mps.field1(), "UP"))
            || (!strcmp(mps.field1(), "FX"))
            || (!strcmp(mps.field1(), "LI"))
            || (!strcmp(mps.field1(), "UI")))
      {
         if((mps.field3() != nullptr) && (mps.field4() == nullptr))
            mps.insertName("_BND_", true);
      }
      else
      {
         if((mps.field2() != nullptr) && (mps.field3() == nullptr))
            mps.insertName("_BND_", true);
      }

      if((mps.field1() == nullptr) || (mps.field2() == nullptr) || (mps.field3() == nullptr))
         break;

      if(*bndname == '\0')
      {
         assert(strlen(mps.field2()) < MPSInput::MAX_LINE_LEN);
         spxSnprintf(bndname, MPSInput::MAX_LINE_LEN, "%s", mps.field2());
      }

      // Only read the first Bound in section
      if(!strcmp(bndname, mps.field2()))
      {
         if((idx = cnames.number(mps.field3())) < 0)
            mps.entryIgnored("column", mps.field3(), "bound", bndname);
         else
         {
            if(mps.field4() == nullptr)
               val = 0.0;
            else if(!strcmp(mps.field4(), "-Inf") || !strcmp(mps.field4(), "-inf"))
               val = R(-infinity);
            else if(!strcmp(mps.field4(), "Inf") || !strcmp(mps.field4(), "inf")
                    || !strcmp(mps.field4(), "+Inf") || !strcmp(mps.field4(), "+inf"))
               val = R(infinity);
            else
               val = atof(mps.field4());

            // ILOG extension (Integer Bound)
            if(mps.field1()[1] == 'I')
            {
               if(intvars != nullptr)
                  intvars->addIdx(idx);

               // if the variable has appeared in the MARKER section of the COLUMNS section then its default bounds were
               // set to 0,1; the first time it is declared integer we need to change to default bounds 0,R(infinity)
               if(oldbinvars.pos(idx) < 0)
               {
                  cset.upper_w(idx) = R(infinity);
                  oldbinvars.addIdx(idx);
               }
            }

            switch(*mps.field1())
            {
            case 'L':
               cset.lower_w(idx) = val;
               break;

            case 'U':
               cset.upper_w(idx) = val;
               break;

            case 'F':
               if(mps.field1()[1] == 'X')
               {
                  cset.lower_w(idx) = val;
                  cset.upper_w(idx) = val;
               }
               else
               {
                  cset.lower_w(idx) = R(-infinity);
                  cset.upper_w(idx) = R(infinity);
               }

               break;

            case 'M':
               cset.lower_w(idx) = R(-infinity);
               break;

            case 'P':
               cset.upper_w(idx) = R(infinity);
               break;

            // Ilog extension (Binary)
            case 'B':
               cset.lower_w(idx) = 0.0;
               cset.upper_w(idx) = 1.0;

               if(intvars != nullptr)
                  intvars->addIdx(idx);

               break;

            default:
               mps.syntaxError();
               return;
            }
         }
      }
   }

   mps.syntaxError();
}